

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matryoshka.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *__args;
  string *psVar2;
  int iVar3;
  void *pvVar4;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *data;
  size_type start1;
  undefined8 uVar5;
  int *piVar6;
  pointer pvVar7;
  undefined1 *puVar8;
  element_type *this;
  undefined1 auVar9 [8];
  undefined8 uVar10;
  size_t sVar11;
  double __n;
  int areaCovered;
  typed_value<double,_char> *ptVar12;
  char *pcVar13;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar14;
  typed_value<unsigned_long,_char> *ptVar15;
  typed_value<bool,_char> *ptVar16;
  typed_value<int,_char> *ptVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  ostream *poVar20;
  double **VI_S;
  double *pdVar21;
  long *plVar22;
  long lVar23;
  pointer pDVar24;
  int *piVar25;
  options_description *poVar26;
  pointer pcVar27;
  int iVar28;
  int *piVar29;
  int iVar30;
  int *piVar31;
  pointer pdVar32;
  _Alloc_hider _Var33;
  size_type *psVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  double dVar38;
  long lVar39;
  ulong uVar40;
  pointer pbVar41;
  float fVar42;
  undefined1 auVar43 [16];
  size_type asStack_840 [2];
  undefined1 *puStack_830;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_828;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_810;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_7f8;
  undefined1 *local_7d0;
  options_description opts;
  undefined1 local_7c0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_7a8 [24];
  void *local_790;
  undefined4 local_788;
  undefined8 local_780;
  undefined4 local_778;
  undefined8 local_770;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_768 [24];
  undefined1 local_750 [8];
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_740 [8];
  _Rb_tree_node_base local_738;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_710 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e0;
  undefined1 local_6b0 [16];
  _Alloc_hider local_6a0;
  char local_690 [16];
  int local_680;
  vector<double,_std::allocator<double>_> local_678;
  double local_660;
  undefined1 local_658 [16];
  _Alloc_hider local_648;
  char local_638 [16];
  int local_628;
  vector<double,_std::allocator<double>_> local_620;
  double local_608;
  string local_600;
  string local_5e0;
  string local_5c0;
  vector<Domain,_std::allocator<Domain>_> local_5a0;
  vector<Domain,_std::allocator<Domain>_> local_588;
  vector<Domain,_std::allocator<Domain>_> local_570;
  undefined1 local_558 [16];
  _Alloc_hider local_548;
  char local_538 [16];
  int local_528;
  vector<double,_std::allocator<double>_> local_520;
  double local_508;
  undefined1 local_500 [16];
  _Alloc_hider local_4f0;
  char local_4e0 [16];
  int local_4d0;
  vector<double,_std::allocator<double>_> local_4c8;
  double local_4b0;
  undefined1 local_4a8 [16];
  _Alloc_hider local_498;
  char local_488 [16];
  int local_478;
  vector<double,_std::allocator<double>_> local_470;
  double local_458;
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  char local_430 [16];
  int local_420;
  vector<double,_std::allocator<double>_> local_418;
  double local_400;
  undefined1 local_3f8 [16];
  _Alloc_hider local_3e8;
  char local_3d8 [16];
  int local_3c8;
  vector<double,_std::allocator<double>_> local_3c0;
  double local_3a8;
  string local_3a0;
  undefined1 local_380 [8];
  vector<int,_std::allocator<int>_> temp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  allMu;
  undefined1 local_340 [24];
  DomainSet dConsensusHier;
  undefined1 local_308 [24];
  pointer local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2e0 [8];
  vector<int,_std::allocator<int>_> PAMresult;
  undefined1 auStack_2b8 [8];
  WeightedDomainEnsemble dEnsemble;
  pointer local_280;
  double local_268;
  size_type *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile_1;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat_topass;
  vector<Domain,_std::allocator<Domain>_> local_1f8;
  undefined1 auStack_1d8 [8];
  vector<Domain,_std::allocator<Domain>_> dConsensusHierTemp;
  undefined1 local_1b8 [8];
  Params p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile;
  undefined1 auStack_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> multiscaleFile;
  ulong local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double local_40;
  pointer local_38;
  
  local_1b8 = (undefined1  [8])&p.inputFile._M_string_length;
  p.inputFile._M_dataplus._M_p = (pointer)0x0;
  p.inputFile._M_string_length._0_1_ = 0;
  p.inputFile.field_2._8_8_ = &p.outputPrefix._M_string_length;
  p.outputPrefix._M_dataplus._M_p = (pointer)0x0;
  p.outputPrefix._M_string_length._0_1_ = 0;
  p._104_8_ = &p.chrom._M_string_length;
  p.chrom._M_dataplus._M_p = (pointer)0x0;
  p.chrom._M_string_length._0_1_ = 0;
  puStack_830 = (undefined1 *)0x125de0;
  local_750 = (undefined1  [8])local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"matryoshka options","");
  puStack_830 = (undefined1 *)0x125e00;
  boost::program_options::options_description::options_description
            ((options_description *)&local_7d0,(string *)local_750,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_40 = (double)CONCAT44(local_40._4_4_,argc);
  if (local_750 != (undefined1  [8])local_740) {
    puStack_830 = (undefined1 *)0x125e15;
    operator_delete((void *)local_750);
  }
  puStack_830 = (undefined1 *)0x125e21;
  local_98._0_8_ = boost::program_options::options_description::add_options();
  puStack_830 = (undefined1 *)0x125e34;
  ptVar12 = boost::program_options::value<double>((double *)((long)&p.outputPrefix.field_2 + 8));
  ptVar12->m_required = true;
  puStack_830 = (undefined1 *)0x125e58;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_98,(value_semantic *)"gammaMax,g",(char *)ptVar12);
  puStack_830 = (undefined1 *)0x125e67;
  ptVar12 = boost::program_options::value<double>(&p.gammaMax);
  auStack_2b8 = (undefined1  [8])0x0;
  puStack_830 = (undefined1 *)0x125e7d;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value
                      (ptVar12,(double *)auStack_2b8);
  puStack_830 = (undefined1 *)0x125e96;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"gammaMin,x",(char *)ptVar12);
  puStack_830 = (undefined1 *)0x125eac;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,"help,h");
  puStack_830 = (undefined1 *)0x125ebb;
  ptVar14 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
  ptVar14->m_required = true;
  puStack_830 = (undefined1 *)0x125edb;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"input,i",(char *)ptVar14);
  puStack_830 = (undefined1 *)0x125eea;
  ptVar15 = boost::program_options::value<unsigned_long>((unsigned_long *)&p.gammaMin);
  auStack_f8 = (undefined1  [8])0x1;
  puStack_830 = (undefined1 *)0x125f00;
  ptVar15 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar15,(unsigned_long *)auStack_f8);
  puStack_830 = (undefined1 *)0x125f19;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"topK,k",(char *)ptVar15);
  puStack_830 = (undefined1 *)0x125f28;
  ptVar16 = boost::program_options::value<bool>((bool *)&p.stepSize);
  ptVar16->m_zero_tokens = true;
  local_380[0] = false;
  puStack_830 = (undefined1 *)0x125f41;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)local_380);
  puStack_830 = (undefined1 *)0x125f5a;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"outputMultiscale,m",(char *)ptVar16);
  puStack_830 = (undefined1 *)0x125f69;
  ptVar17 = boost::program_options::value<int>((int *)((long)&p.stepSize + 4));
  local_258 = (size_type *)CONCAT44(local_258._4_4_,100);
  puStack_830 = (undefined1 *)0x125f7e;
  ptVar17 = boost::program_options::typed_value<int,_char>::default_value(ptVar17,(int *)&local_258)
  ;
  puStack_830 = (undefined1 *)0x125f97;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"minMeanSamples,n",(char *)ptVar17);
  puStack_830 = (undefined1 *)0x125fa6;
  ptVar14 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&p.inputFile.field_2 + 8));
  ptVar14->m_required = true;
  puStack_830 = (undefined1 *)0x125fc6;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"output,o",(char *)ptVar14);
  puStack_830 = (undefined1 *)0x125fd5;
  ptVar12 = boost::program_options::value<double>((double *)&p.k);
  p.chrom.field_2._8_8_ = 0x3fa999999999999a;
  puStack_830 = (undefined1 *)0x125ff1;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value
                      (ptVar12,(double *)((long)&p.chrom.field_2 + 8));
  puStack_830 = (undefined1 *)0x12600a;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"stepSize,s",(char *)ptVar12);
  puStack_830 = (undefined1 *)0x126019;
  ptVar17 = boost::program_options::value<int>((int *)&p.outputMultiscale);
  local_2e0._0_4_ = 40000;
  puStack_830 = (undefined1 *)0x12602e;
  ptVar17 = boost::program_options::typed_value<int,_char>::default_value(ptVar17,(int *)local_2e0);
  puStack_830 = (undefined1 *)0x126047;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"resolution,r",(char *)ptVar17);
  puStack_830 = (undefined1 *)0x126056;
  ptVar16 = boost::program_options::value<bool>((bool *)&p.minMeanSamples);
  ptVar16->m_zero_tokens = true;
  local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffffffffff00);
  puStack_830 = (undefined1 *)0x12606f;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)&local_1f8);
  puStack_830 = (undefined1 *)0x126088;
  pcVar13 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar13,(value_semantic *)"parseSparseFormat,R",(char *)ptVar16);
  piVar6 = &p.resolution;
  puStack_830 = (undefined1 *)0x12609a;
  ptVar14 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar6);
  puStack_830 = (undefined1 *)0x1260ba;
  local_750 = (undefined1  [8])local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"N/A","");
  puStack_830 = (undefined1 *)0x1260c9;
  ptVar14 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_750);
  puStack_830 = (undefined1 *)0x1260e2;
  boost::program_options::options_description_easy_init::operator()
            (pcVar13,(value_semantic *)"chromosome,c",(char *)ptVar14);
  if (local_750 != (undefined1  [8])local_740) {
    puStack_830 = (undefined1 *)0x1260f3;
    operator_delete((void *)local_750);
  }
  puStack_830 = (undefined1 *)0x1260ff;
  boost::program_options::variables_map::variables_map((variables_map *)local_750);
  local_7f8.super_function_base.vtable = (vtable_base *)0x0;
  local_7f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_7f8.super_function_base.functor._8_8_ = 0;
  local_7f8.super_function_base.functor._16_8_ = 0;
  puStack_830 = (undefined1 *)0x12612e;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_98,local_40._0_4_,argv,
             (options_description *)&local_7d0,0,&local_7f8);
  puStack_830 = (undefined1 *)0x126143;
  boost::program_options::store((basic_parsed_options *)local_98,(variables_map *)local_750,false);
  puStack_830 = (undefined1 *)0x12614f;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_98);
  puStack_830 = (undefined1 *)0x12615b;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_7f8);
  pbVar41 = (pointer)(local_98 + 0x10);
  puStack_830 = (undefined1 *)0x12617d;
  local_98._0_8_ = pbVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"help","");
  puStack_830 = (undefined1 *)0x126193;
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_740,(key_type *)local_98);
  if ((pointer)local_98._0_8_ != pbVar41) {
    puStack_830 = (undefined1 *)0x1261ae;
    operator_delete((void *)local_98._0_8_);
  }
  if (cVar18._M_node != &local_738) {
    puStack_830 = (undefined1 *)0x1279d7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\n\t***********************************\n\t****                           ****\n\t****        MATRYOSHKA 1.0     ****\n\t****                           ****\n\t***********************************\n\t"
               ,0xbb);
    puStack_830 = (undefined1 *)0x1279ef;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    puStack_830 = (undefined1 *)0x127a02;
    poVar20 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cerr,(options_description *)&local_7d0);
    puStack_830 = (undefined1 *)0x127a11;
    std::operator<<(poVar20,"\n");
LAB_001280e7:
    puStack_830 = &LAB_001280f1;
    exit(1);
  }
  puStack_830 = (undefined1 *)0x1261c3;
  boost::program_options::notify((variables_map *)local_750);
  puStack_830 = (undefined1 *)0x1261e0;
  local_98._0_8_ = pbVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"input","");
  puStack_830 = (undefined1 *)0x1261ef;
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_740,(key_type *)local_98);
  if ((pointer)local_98._0_8_ != pbVar41) {
    puStack_830 = (undefined1 *)0x126203;
    operator_delete((void *)local_98._0_8_);
  }
  if (cVar19._M_node == cVar18._M_node) {
    puStack_830 = (undefined1 *)0x127a29;
    std::operator<<((ostream *)&std::cerr,"Input file was not set.\n");
    goto LAB_001280e7;
  }
  puStack_830 = (undefined1 *)0x126224;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading input from ",0x13);
  puStack_830 = (undefined1 *)0x12623e;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_1b8,(long)p.inputFile._M_dataplus._M_p);
  puStack_830 = (undefined1 *)0x126252;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,".\n",2);
  puStack_830 = (undefined1 *)0x126268;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"chr"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar6);
  puStack_830 = (undefined1 *)0x12627a;
  std::__cxx11::string::operator=((string *)piVar6,(string *)local_98);
  if ((pointer)local_98._0_8_ != pbVar41) {
    puStack_830 = (undefined1 *)0x126287;
    operator_delete((void *)local_98._0_8_);
  }
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_88._M_allocated_capacity = (size_type)&local_78;
  local_88._8_8_ = (options_description *)0x0;
  local_78._M_local_buf[0] = '\0';
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((char)p.minMeanSamples == '\x01') {
    puStack_830 = (undefined1 *)0x1262e0;
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_600,local_1b8,p.inputFile._M_dataplus._M_p + (long)local_1b8);
    puStack_830 = (undefined1 *)0x12630f;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,p._104_8_,p.chrom._M_dataplus._M_p + p._104_8_);
    puStack_830 = (undefined1 *)0x12632c;
    parseSparseMatrix((MatrixProperties *)auStack_2b8,&local_600,p._96_4_,&local_5e0);
    uVar10 = local_98._8_8_;
    local_98._8_8_ =
         dEnsemble.domainSets.
         super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98._0_8_ = auStack_2b8;
    auStack_2b8 = (undefined1  [8])0x0;
    dEnsemble.domainSets.
    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((pointer)uVar10 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126355;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
    }
    puStack_830 = (undefined1 *)0x126367;
    std::__cxx11::string::operator=
              ((string *)(local_98 + 0x10),
               (string *)
               &dEnsemble.domainSets.
                super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    pdVar32 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_68 = (int)dEnsemble.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_280;
    if (pdVar32 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x1263a1;
      operator_delete(pdVar32);
    }
    local_48 = local_268;
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)&dEnsemble.weights) {
      puStack_830 = (undefined1 *)0x1264f7;
      operator_delete(dEnsemble.domainSets.
                      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126508;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 dEnsemble.domainSets.
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      puStack_830 = (undefined1 *)0x126519;
      operator_delete(local_5e0._M_dataplus._M_p);
    }
    _Var33._M_p = local_600._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p == &local_600.field_2) goto LAB_0012652a;
  }
  else {
    puStack_830 = (undefined1 *)0x1263f0;
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5c0,local_1b8,p.inputFile._M_dataplus._M_p + (long)local_1b8);
    puStack_830 = (undefined1 *)0x126403;
    parseGZipMatrix((MatrixProperties *)auStack_2b8,&local_5c0);
    uVar10 = local_98._8_8_;
    local_98._8_8_ =
         dEnsemble.domainSets.
         super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98._0_8_ = auStack_2b8;
    auStack_2b8 = (undefined1  [8])0x0;
    dEnsemble.domainSets.
    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((pointer)uVar10 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x12642c;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
    }
    puStack_830 = (undefined1 *)0x12643e;
    std::__cxx11::string::operator=
              ((string *)(local_98 + 0x10),
               (string *)
               &dEnsemble.domainSets.
                super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    pdVar32 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_68 = (int)dEnsemble.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_280;
    if (pdVar32 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126474;
      operator_delete(pdVar32);
    }
    local_48 = local_268;
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)&dEnsemble.weights) {
      puStack_830 = (undefined1 *)0x1264b6;
      operator_delete(dEnsemble.domainSets.
                      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x1264c7;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 dEnsemble.domainSets.
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var33._M_p = local_5c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p == &local_5c0.field_2) goto LAB_0012652a;
  }
  puStack_830 = (undefined1 *)0x12652a;
  operator_delete(_Var33._M_p);
LAB_0012652a:
  uVar5 = local_98._8_8_;
  uVar10 = local_98._0_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  puStack_830 = (undefined1 *)0x126573;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"MatrixParser read matrix of size: ",0x22);
  puStack_830 = (undefined1 *)0x126589;
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  puStack_830 = (undefined1 *)0x1265a0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," x ",3);
  puStack_830 = (undefined1 *)0x1265b3;
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
  puStack_830 = (undefined1 *)0x1265c7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
  local_6b0._0_8_ = local_98._0_8_;
  local_6b0._8_8_ = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_38 = (pointer)uVar5;
  puStack_830 = (undefined1 *)0x126623;
  local_6a0._M_p = local_690;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a0,local_88._M_allocated_capacity,
             (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
  local_680 = local_68;
  puStack_830 = (undefined1 *)0x126639;
  std::vector<double,_std::allocator<double>_>::vector(&local_678,&local_60);
  local_660 = local_48;
  puStack_830 = (undefined1 *)0x12667a;
  multiscaleDomains((WeightedDomainEnsemble *)auStack_2b8,(MatrixProperties *)local_6b0,
                    (float)(double)p.outputPrefix.field_2._8_8_,(float)p.gammaMax,(double)p.k,
                    p.gammaMin._0_4_,p.stepSize._4_4_);
  if (local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x12668b;
    operator_delete(local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6a0._M_p != local_690) {
    puStack_830 = (undefined1 *)0x12669c;
    operator_delete(local_6a0._M_p);
  }
  if ((pointer)local_6b0._8_8_ != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x1266ad;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b0._8_8_);
  }
  local_658._0_8_ = local_98._0_8_;
  local_658._8_8_ = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  puStack_830 = (undefined1 *)0x126705;
  local_648._M_p = local_638;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_648,local_88._M_allocated_capacity,
             (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
  local_628 = local_68;
  puStack_830 = (undefined1 *)0x12671b;
  std::vector<double,_std::allocator<double>_>::vector(&local_620,&local_60);
  local_608 = local_48;
  puStack_830 = (undefined1 *)0x126738;
  areaCovered = calCoverage((WeightedDomainEnsemble *)auStack_2b8,(MatrixProperties *)local_658);
  if (local_620.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x12674f;
    operator_delete(local_620.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_648._M_p != local_638) {
    puStack_830 = (undefined1 *)0x126760;
    operator_delete(local_648._M_p);
  }
  if ((pointer)local_658._8_8_ != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x126771;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_658._8_8_);
  }
  local_40 = (double)(((long)dEnsemble.domainSets.
                             super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_2b8 >> 3) *
                     -0x5555555555555555);
  if (p.stepSize._0_1_ == '\x01') {
    puStack_830 = (undefined1 *)0x1267bd;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Writing all multi scale domains to file",0x27);
    puStack_830 = (undefined1 *)0x1267d1;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    puStack_830 = (undefined1 *)0x1267e0;
    std::ostream::put('\b');
    puStack_830 = (undefined1 *)0x1267e8;
    std::ostream::flush();
    if (0 < (int)local_40._0_4_) {
      uVar37 = local_40._0_4_ & 0x7fffffff;
      lVar39 = 0;
      uVar36 = 0;
      do {
        auStack_f8 = (undefined1  [8])&multiscaleFile._M_string_length;
        puStack_830 = (undefined1 *)0x126831;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_f8,p.inputFile.field_2._8_8_,
                   p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_);
        puStack_830 = (undefined1 *)0x126843;
        std::__cxx11::string::append((char *)auStack_f8);
        puStack_830 = (undefined1 *)0x126859;
        std::vector<Domain,_std::allocator<Domain>_>::vector
                  (&local_5a0,
                   (vector<Domain,_std::allocator<Domain>_> *)
                   ((long)(size_type *)auStack_2b8 + lVar39));
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        puStack_830 = (undefined1 *)0x126884;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,auStack_f8,
                   multiscaleFile._M_dataplus._M_p + (long)auStack_f8);
        local_558._0_8_ = local_98._0_8_;
        local_558._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_548._M_p = local_538;
        puStack_830 = (undefined1 *)0x1268df;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_548,local_88._M_allocated_capacity,
                   (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
        local_528 = local_68;
        puStack_830 = (undefined1 *)0x1268f8;
        std::vector<double,_std::allocator<double>_>::vector(&local_520,&local_60);
        local_508 = local_48;
        puStack_830 = (undefined1 *)0x12693d;
        outputDomains(&local_5a0,&local_3a0,(MatrixProperties *)local_558,0,
                      (float)((double)(int)uVar36 * (double)p.k + p.gammaMax));
        if (local_520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x12694e;
          operator_delete(local_520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_548._M_p != local_538) {
          puStack_830 = (undefined1 *)0x126966;
          operator_delete(local_548._M_p);
        }
        if ((pointer)local_558._8_8_ != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x126977;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          puStack_830 = (undefined1 *)0x12698f;
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if (local_5a0.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x1269a0;
          operator_delete(local_5a0.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (auStack_f8 != (undefined1  [8])&multiscaleFile._M_string_length) {
          puStack_830 = (undefined1 *)0x1269b8;
          operator_delete((void *)auStack_f8);
        }
        uVar36 = uVar36 + 1;
        lVar39 = lVar39 + 0x18;
      } while (uVar37 != uVar36);
    }
  }
  iVar28 = SUB84(local_40,0);
  dVar38 = (double)(long)iVar28;
  uVar36 = -(ulong)((ulong)dVar38 >> 0x3d != 0) | (long)dVar38 * 8;
  puStack_830 = (undefined1 *)0x1269f5;
  VI_S = (double **)operator_new__(uVar36);
  if (0 < iVar28) {
    uVar37 = SUB84(local_40,0);
    uVar40 = 0;
    do {
      puStack_830 = (undefined1 *)0x126a11;
      pdVar21 = (double *)operator_new__(uVar36);
      VI_S[uVar40] = pdVar21;
      uVar40 = uVar40 + 1;
    } while ((uVar37 & 0x7fffffff) != uVar40);
  }
  puStack_830 = (undefined1 *)0x126a2c;
  getVImatrix((WeightedDomainEnsemble *)auStack_2b8,VI_S);
  puStack_830 = (undefined1 *)0x126a3f;
  getCluster((vector<int,_std::allocator<int>_> *)local_2e0,VI_S,SUB84(local_40,0));
  lVar39 = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
  puStack_830 = (undefined1 *)0x126a59;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_380,
             (vector<int,_std::allocator<int>_> *)local_2e0);
  piVar6 = (int *)CONCAT71(local_380._1_7_,local_380[0]);
  piVar25 = piVar6;
  if (piVar6 != temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) {
    piVar25 = piVar6 + 1;
    do {
      piVar31 = piVar25;
      piVar25 = temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (piVar31 ==
          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) goto LAB_00126aad;
      piVar25 = piVar31 + 1;
    } while (piVar31[-1] != *piVar31);
    piVar29 = piVar31 + -1;
    iVar28 = piVar31[-1];
    for (; piVar25 !=
           temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start; piVar25 = piVar25 + 1) {
      iVar35 = *piVar25;
      if (iVar28 != iVar35) {
        piVar29[1] = iVar35;
        piVar29 = piVar29 + 1;
      }
      iVar28 = iVar35;
    }
    piVar25 = piVar29 + 1;
  }
LAB_00126aad:
  puStack_830 = (undefined1 *)0x126ac9;
  local_40 = dVar38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"There are ",10);
  uVar36 = (long)piVar25 - (long)piVar6 >> 2;
  puStack_830 = (undefined1 *)0x126ae6;
  iVar28 = (int)uVar36;
  poVar20 = (ostream *)std::ostream::operator<<(&std::cerr,iVar28);
  puStack_830 = (undefined1 *)0x126afd;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar20," levels of hierarchy with clustering: ",0x26);
  puStack_830 = (undefined1 *)0x126b11;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  puStack_830 = (undefined1 *)0x126b1c;
  std::ostream::put((char)poVar20);
  puStack_830 = (undefined1 *)0x126b24;
  std::ostream::flush();
  uVar37 = (uint)((ulong)((long)PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start - lVar39) >> 2);
  if (0 < (int)uVar37) {
    uVar40 = 0;
    do {
      puStack_830 = (undefined1 *)0x126b60;
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (&std::cerr,
                           *(int *)(CONCAT44(local_2e0._4_4_,local_2e0._0_4_) + uVar40 * 4));
      puStack_830 = (undefined1 *)0x126b70;
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      uVar40 = uVar40 + 1;
    } while ((uVar37 & 0x7fffffff) != uVar40);
  }
  puStack_830 = (undefined1 *)0x126b90;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  puStack_830 = (undefined1 *)0x126ba6;
  std::ostream::put('\b');
  puStack_830 = (undefined1 *)0x126bae;
  std::ostream::flush();
  dVar38 = p.gammaMax;
  uVar36 = (uVar36 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0;
  lVar39 = -uVar36;
  pdVar21 = (double *)((long)&local_828 + lVar39);
  psVar34 = (size_type *)((long)pdVar21 - uVar36);
  piVar31 = (int *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
  iVar35 = *piVar31;
  local_2e8 = (undefined1 *)&local_828;
  *pdVar21 = p.gammaMax;
  *(undefined8 *)
   ((long)psVar34 + (((long)piVar25 - (long)piVar6) * 0x40000000 + -0x100000000 >> 0x1d)) =
       p.outputPrefix.field_2._8_8_;
  __n = local_40;
  if (0 < (int)uVar37) {
    uVar36 = 0;
    iVar30 = 0;
    do {
      iVar3 = piVar31[uVar36];
      if (iVar35 != iVar3) {
        lVar23 = (long)iVar30;
        iVar30 = iVar30 + 1;
        *(double *)((long)&local_828 + lVar23 * 8 + lVar39 + 8) = dVar38;
        psVar34[lVar23] = (size_type)(dVar38 - (double)p.k);
        iVar35 = iVar3;
      }
      dVar38 = dVar38 + (double)p.k;
      uVar36 = uVar36 + 1;
    } while ((uVar37 & 0x7fffffff) != uVar36);
  }
  local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_1d8 = (undefined1  [8])0x0;
  dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  psVar34[-1] = 0x126cb2;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(size_type)__n,(allocator_type *)auStack_f8);
  if (p.gammaMax <= (double)p.outputPrefix.field_2._8_8_ + 1e-05) {
    lVar23 = 0;
    dVar38 = p.gammaMax;
    do {
      pbVar41 = local_38;
      iVar35 = p.stepSize._4_4_;
      PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)uVar10;
      if (local_38 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(local_38->string_key)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(local_38->string_key)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      local_40 = dVar38;
      psVar34[-1] = 0x126d3f;
      getMu((vector<double,_std::allocator<double>_> *)auStack_f8,
            (shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             *)&PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(float)dVar38,iVar35);
      pvVar4 = *(void **)((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + lVar23);
      *(undefined8 *)
       ((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + lVar23) = auStack_f8;
      ((undefined8 *)
      ((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + lVar23))[1] = multiscaleFile._M_dataplus._M_p;
      *(size_type *)
       ((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + lVar23 + 0x10) = multiscaleFile._M_string_length;
      auStack_f8 = (undefined1  [8])0x0;
      multiscaleFile._M_dataplus._M_p = (pointer)0x0;
      multiscaleFile._M_string_length = 0;
      if (pvVar4 != (void *)0x0) {
        psVar34[-1] = 0x126d81;
        operator_delete(pvVar4);
        auVar9 = auStack_f8;
        if (auStack_f8 != (undefined1  [8])0x0) {
          psVar34[-1] = 0x126d92;
          operator_delete((void *)auVar9);
        }
      }
      if (pbVar41 != (pointer)0x0) {
        psVar34[-1] = 0x126da3;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar41);
      }
      dVar38 = local_40 + (double)p.k;
      lVar23 = lVar23 + 0x18;
    } while (dVar38 <= (double)p.outputPrefix.field_2._8_8_ + 1e-05);
  }
  pbVar41 = local_38;
  if (0 < iVar28) {
    local_40 = (double)CONCAT44(local_40._4_4_,1);
    local_a0 = 0;
    uVar36 = 1;
    iVar35 = 0;
    do {
      uVar5 = local_88._M_allocated_capacity;
      if (uVar36 == 1) {
        p.outputPrefix.field_2._8_8_ = *psVar34;
        p.gammaMax = *pdVar21;
        local_500._0_8_ = local_98._0_8_;
        local_500._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_4f0._M_p = local_4e0;
        poVar26 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
        psVar34[-1] = 0x127449;
        std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,uVar5,poVar26);
        local_4d0 = local_68;
        psVar34[-1] = 0x127462;
        std::vector<double,_std::allocator<double>_>::vector(&local_4c8,&local_60);
        iVar3 = p.stepSize._4_4_;
        sVar11 = p.k;
        iVar30 = p.gammaMin._0_4_;
        dVar38 = p.gammaMax;
        local_4b0 = local_48;
        mat_topass.
        super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
        psVar34[-1] = 0x1274c2;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_828,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        fVar42 = (float)(double)mat_topass.
                                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
        psVar34[-2] = local_a0;
        psVar34[-3] = 0x127509;
        multiscaleDomains((WeightedDomainEnsemble *)auStack_f8,(MatrixProperties *)local_500,fVar42,
                          (float)dVar38,(double)sVar11,iVar30,iVar3,areaCovered,&local_828,
                          (int)psVar34[-2]);
        psVar34[-1] = 0x127515;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_828);
        pdVar32 = local_4c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_4c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar34[-1] = 0x127526;
          operator_delete(pdVar32);
        }
        _Var33._M_p = local_4f0._M_p;
        if (local_4f0._M_p != local_4e0) {
          psVar34[-1] = 0x127545;
          operator_delete(_Var33._M_p);
        }
        uVar5 = local_500._8_8_;
        if ((pointer)local_500._8_8_ != (pointer)0x0) {
          psVar34[-1] = 0x127556;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
        }
        psVar34[-1] = 0x127565;
        consensusDomains((DomainSet *)((long)&p.chrom.field_2 + 8),
                         (WeightedDomainEnsemble *)auStack_f8);
        pDVar24 = local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)p.chrom.field_2._8_8_;
        local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)consensusFile._M_dataplus._M_p;
        local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)consensusFile._M_string_length;
        p.chrom.field_2._8_8_ = 0;
        consensusFile._M_dataplus._M_p = (pointer)0x0;
        consensusFile._M_string_length = 0;
        if (pDVar24 != (pointer)0x0) {
          psVar34[-1] = 0x1275a7;
          operator_delete(pDVar24);
          uVar5 = p.chrom.field_2._8_8_;
          if (p.chrom.field_2._8_8_ != 0) {
            psVar34[-1] = 0x1275b8;
            operator_delete((void *)uVar5);
          }
        }
        uVar5 = p.inputFile.field_2._8_8_;
        p.chrom.field_2._8_8_ = &consensusFile._M_string_length;
        pcVar27 = p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_;
        psVar2 = (string *)(p.chrom.field_2._M_local_buf + 8);
        psVar34[-1] = 0x1275e6;
        std::__cxx11::string::_M_construct<char*>(psVar2,uVar5,pcVar27);
        psVar34[-1] = 0x1275f5;
        std::__cxx11::string::append((char *)psVar2);
        psVar34[-1] = 0x12760d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing consensus for level ",0x1c);
        psVar34[-1] = 0x12761e;
        plVar22 = (long *)std::ostream::operator<<(&std::cerr,1);
        uVar5 = *(undefined8 *)(*plVar22 + -0x18);
        psVar34[-1] = 0x127635;
        std::ios::widen((char)uVar5 + (char)plVar22);
        psVar34[-1] = 0x127640;
        std::ostream::put((char)plVar22);
        psVar34[-1] = 0x127648;
        std::ostream::flush();
        psVar34[-1] = 0x12765b;
        std::vector<Domain,_std::allocator<Domain>_>::vector(&local_588,&local_1f8);
        uVar5 = p.chrom.field_2._8_8_;
        allMu.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_340;
        pcVar27 = consensusFile._M_dataplus._M_p + p.chrom.field_2._8_8_;
        psVar34[-1] = 0x127686;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &allMu.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar5,pcVar27);
        uVar5 = local_88._M_allocated_capacity;
        local_4a8._0_8_ = local_98._0_8_;
        local_4a8._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_498._M_p = local_488;
        poVar26 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
        psVar34[-1] = 0x1276e1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_498,uVar5,poVar26);
        local_478 = local_68;
        psVar34[-1] = 0x1276fa;
        std::vector<double,_std::allocator<double>_>::vector(&local_470,&local_60);
        local_458 = local_48;
        iVar30 = local_40._0_4_;
        psVar34[-1] = 0x127730;
        iVar30 = outputDomains(&local_588,
                               (string *)
                               &allMu.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (MatrixProperties *)local_4a8,1,iVar30,-1);
        pdVar32 = local_470.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_40 = (double)CONCAT44(local_40._4_4_,iVar30);
        if (local_470.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar34[-1] = 0x127744;
          operator_delete(pdVar32);
        }
        _Var33._M_p = local_498._M_p;
        if (local_498._M_p != local_488) {
          psVar34[-1] = 0x12775c;
          operator_delete(_Var33._M_p);
        }
        uVar5 = local_4a8._8_8_;
        if ((pointer)local_4a8._8_8_ != (pointer)0x0) {
          psVar34[-1] = 0x12776d;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
        }
        pvVar7 = allMu.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (allMu.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_340) {
          psVar34[-1] = 0x127785;
          operator_delete(pvVar7);
        }
        pDVar24 = local_588.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_588.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar34[-1] = 0x127796;
          operator_delete(pDVar24);
        }
        uVar5 = p.chrom.field_2._8_8_;
        dVar38 = ((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k;
        if ((size_type *)p.chrom.field_2._8_8_ != &consensusFile._M_string_length) {
          psVar34[-1] = 0x1277d6;
          operator_delete((void *)uVar5);
        }
        uVar5 = multiscaleFile.field_2._M_allocated_capacity;
        if (multiscaleFile.field_2._M_allocated_capacity != 0) {
          psVar34[-1] = 0x1277e7;
          operator_delete((void *)uVar5);
        }
        iVar30 = (int)(dVar38 + 0.5);
        psVar34[-1] = 0x127800;
        std::
        vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                   *)auStack_f8);
      }
      else {
        p.outputPrefix.field_2._8_8_ = psVar34[uVar36 - 1];
        p.gammaMax = *(double *)((long)&puStack_830 + uVar36 * 8 + lVar39);
        if ((undefined1  [8])
            dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != auStack_1d8) {
          psVar34[-1] = 0x126ed0;
          std::vector<Domain,_std::allocator<Domain>_>::operator=
                    (&local_1f8,(vector<Domain,_std::allocator<Domain>_> *)auStack_1d8);
          if ((undefined1  [8])
              dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
              super__Vector_impl_data._M_start != auStack_1d8) {
            dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)auStack_1d8;
          }
        }
        local_2f0 = local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        pDVar24 = local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            data = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)pDVar24->start;
            local_308._16_8_ = pDVar24;
            start1 = pDVar24->end;
            psVar34[-1] = 0x126f35;
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                      ((matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)auStack_f8,(ublas *)uVar10,data,start1,(size_type)data,start1,*psVar34);
            __args = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)(p.chrom.field_2._M_local_buf + 8);
            psVar34[-1] = 0x126f47;
            boost::numeric::ublas::
            matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
            ::
            matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                      ((matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                        *)__args,
                       (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                        *)auStack_f8);
            consensusFile_1.field_2._8_8_ = 0;
            psVar34[-1] = 0x126f67;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::allocator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat_topass,
                       (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        **)((long)&consensusFile_1.field_2 + 8),
                       (allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)auStack_f8,__args);
            local_98._0_8_ = consensusFile_1.field_2._8_8_;
            psVar34[-1] = 0x126f84;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat_topass);
            uVar5 = local_88._M_allocated_capacity;
            local_450._0_8_ = local_98._0_8_;
            local_450._8_8_ = local_98._8_8_;
            if ((pointer)local_98._8_8_ != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            local_440._M_p = local_430;
            poVar26 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
            psVar34[-1] = 0x126fe2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_440,uVar5,poVar26);
            local_420 = local_68;
            psVar34[-1] = 0x126ffb;
            std::vector<double,_std::allocator<double>_>::vector(&local_418,&local_60);
            iVar3 = p.stepSize._4_4_;
            sVar11 = p.k;
            iVar30 = p.gammaMin._0_4_;
            dVar38 = p.gammaMax;
            local_400 = local_48;
            mat_topass.
            super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
            psVar34[-1] = 0x12705c;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_810,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
            fVar42 = (float)(double)mat_topass.
                                    super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
            psVar34[-2] = local_a0;
            psVar34[-3] = 0x1270a3;
            multiscaleDomains((WeightedDomainEnsemble *)auStack_f8,(MatrixProperties *)local_450,
                              fVar42,(float)dVar38,(double)sVar11,iVar30,iVar3,areaCovered,
                              &local_810,(int)psVar34[-2]);
            psVar34[-1] = 0x1270af;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_810);
            pbVar41 = local_38;
            pdVar32 = local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar34[-1] = 0x1270c4;
              operator_delete(pdVar32);
            }
            _Var33._M_p = local_440._M_p;
            if (local_440._M_p != local_430) {
              psVar34[-1] = 0x1270e3;
              operator_delete(_Var33._M_p);
            }
            uVar5 = local_450._8_8_;
            if ((pointer)local_450._8_8_ != (pointer)0x0) {
              psVar34[-1] = 0x1270f4;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
            }
            psVar34[-1] = 0x127107;
            consensusDomains((DomainSet *)(local_340 + 0x10),(WeightedDomainEnsemble *)auStack_f8);
            pDVar24 = dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl
                      .super__Vector_impl_data._M_start;
            if ((long)dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                      super__Vector_impl_data._M_start - local_340._16_8_ != 0) {
              lVar23 = ((long)dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>.
                              _M_impl.super__Vector_impl_data._M_start - local_340._16_8_ >> 3) *
                       -0x5555555555555555;
              lVar23 = lVar23 + (ulong)(lVar23 == 0);
              auVar43._8_4_ = (int)data;
              auVar43._0_8_ = data;
              auVar43._12_4_ = (int)((ulong)data >> 0x20);
              pdVar32 = (pointer)local_340._16_8_;
              do {
                *pdVar32 = (double)((long)&data->size1_ + (long)*pdVar32);
                pdVar32[1] = (double)((long)pdVar32[1] + auVar43._8_8_);
                pdVar32 = pdVar32 + 3;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
            }
            psVar34[-1] = 0x12716c;
            std::vector<Domain,std::allocator<Domain>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>>
                      ((vector<Domain,std::allocator<Domain>> *)auStack_1d8,pDVar24);
            uVar5 = p.inputFile.field_2._8_8_;
            local_258 = &consensusFile_1._M_string_length;
            pcVar27 = p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_;
            psVar34[-1] = 0x12719a;
            std::__cxx11::string::_M_construct<char*>((string *)&local_258,uVar5,pcVar27);
            psVar34[-1] = 0x1271a9;
            std::__cxx11::string::append((char *)&local_258);
            psVar34[-1] = 0x1271bc;
            std::vector<Domain,_std::allocator<Domain>_>::vector
                      (&local_570,(vector<Domain,_std::allocator<Domain>_> *)(local_340 + 0x10));
            psVar1 = local_258;
            dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_308;
            pcVar27 = consensusFile_1._M_dataplus._M_p + (long)local_258;
            psVar34[-1] = 0x1271e7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,psVar1,pcVar27);
            uVar5 = local_88._M_allocated_capacity;
            local_3f8._0_8_ = local_98._0_8_;
            local_3f8._8_8_ = local_98._8_8_;
            if ((pointer)local_98._8_8_ != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            local_3e8._M_p = local_3d8;
            poVar26 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
            psVar34[-1] = 0x127242;
            std::__cxx11::string::_M_construct<char*>((string *)&local_3e8,uVar5,poVar26);
            local_3c8 = local_68;
            psVar34[-1] = 0x12725b;
            std::vector<double,_std::allocator<double>_>::vector(&local_3c0,&local_60);
            iVar35 = iVar35 + 1;
            local_3a8 = local_48;
            iVar30 = local_40._0_4_;
            psVar34[-1] = 0x12729e;
            iVar30 = outputDomains(&local_570,
                                   (string *)
                                   &dConsensusHier.
                                    super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                                   (MatrixProperties *)local_3f8,(int)uVar36,iVar30,iVar35);
            pdVar32 = local_3c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_40 = (double)CONCAT44(local_40._4_4_,iVar30);
            if (local_3c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar34[-1] = 0x1272b2;
              operator_delete(pdVar32);
            }
            _Var33._M_p = local_3e8._M_p;
            if (local_3e8._M_p != local_3d8) {
              psVar34[-1] = 0x1272ca;
              operator_delete(_Var33._M_p);
            }
            uVar5 = local_3f8._8_8_;
            if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
              psVar34[-1] = 0x1272db;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
            }
            pDVar24 = dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)local_308) {
              psVar34[-1] = 0x1272f3;
              operator_delete(pDVar24);
            }
            pDVar24 = local_570.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_570.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar34[-1] = 0x127304;
              operator_delete(pDVar24);
            }
            psVar1 = local_258;
            if (local_258 != &consensusFile_1._M_string_length) {
              psVar34[-1] = 0x12731c;
              operator_delete(psVar1);
            }
            uVar5 = local_340._16_8_;
            if ((pointer)local_340._16_8_ != (pointer)0x0) {
              psVar34[-1] = 0x12732d;
              operator_delete((void *)uVar5);
            }
            uVar5 = multiscaleFile.field_2._M_allocated_capacity;
            if (multiscaleFile.field_2._M_allocated_capacity != 0) {
              psVar34[-1] = 0x12733e;
              operator_delete((void *)uVar5);
            }
            psVar34[-1] = 0x12734a;
            std::
            vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
            ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                       *)auStack_f8);
            this = mat_topass.
                   super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
            if (mat_topass.
                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              psVar34[-1] = 0x12735b;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
            }
            uVar5 = consensusFile.field_2._8_8_;
            if (consensusFile.field_2._M_allocated_capacity != 0) {
              psVar34[-1] = 0x127371;
              operator_delete((void *)uVar5);
            }
            pDVar24 = (pointer)(local_308._16_8_ + 0x18);
          } while (pDVar24 != local_2f0);
        }
        psVar34[-1] = 0x1273a1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing consensus for level ",0x1c);
        psVar34[-1] = 0x1273bb;
        plVar22 = (long *)std::ostream::operator<<(&std::cerr,(int)uVar36);
        uVar5 = *(undefined8 *)(*plVar22 + -0x18);
        psVar34[-1] = 0x1273d2;
        std::ios::widen((char)uVar5 + (char)plVar22);
        psVar34[-1] = 0x1273dd;
        std::ostream::put((char)plVar22);
        psVar34[-1] = 0x1273e5;
        std::ostream::flush();
        iVar30 = (int)local_a0 +
                 (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5);
      }
      local_a0 = (ulong)(iVar30 + 1);
      uVar36 = uVar36 + 1;
    } while (uVar36 != iVar28 + 1);
  }
  psVar34[-1] = 0x127826;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  auVar9 = auStack_1d8;
  if (auStack_1d8 != (undefined1  [8])0x0) {
    psVar34[-1] = 0x127837;
    operator_delete((void *)auVar9);
  }
  pDVar24 = local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_1f8.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    psVar34[-1] = 0x127853;
    operator_delete(pDVar24);
  }
  puVar8 = local_2e8;
  pvVar4 = (void *)CONCAT71(local_380._1_7_,local_380[0]);
  if (pvVar4 != (void *)0x0) {
    *(undefined8 *)(local_2e8 + -8) = 0x12786b;
    operator_delete(pvVar4);
  }
  pvVar4 = (void *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
  if (pvVar4 != (void *)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x12787c;
    operator_delete(pvVar4);
  }
  if (dEnsemble.domainSets.
      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x12788d;
    operator_delete(dEnsemble.domainSets.
                    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  *(undefined8 *)(puVar8 + -8) = 0x127899;
  std::
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
             *)auStack_2b8);
  if (pbVar41 != (pointer)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x1278a6;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar41);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x1278b4;
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar10 = local_88._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    *(undefined8 *)(puVar8 + -8) = 0x1278d0;
    operator_delete((void *)uVar10);
  }
  uVar10 = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x1278e1;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
  }
  local_750 = (undefined1  [8])std::ios::clear;
  *(undefined8 *)(puVar8 + -8) = 0x1278fc;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_6e0);
  *(undefined8 *)(puVar8 + -8) = 0x127908;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_710);
  *(undefined8 *)(puVar8 + -8) = 0x127910;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_740);
  *(undefined8 *)(puVar8 + -8) = 0x12791f;
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_768);
  if (local_790 != (void *)0x0) {
    *(undefined8 *)(puVar8 + -8) = 0x12792d;
    operator_delete(local_790);
    local_790 = (void *)0x0;
    local_788 = 0;
    local_780 = 0;
    local_778 = 0;
    local_770 = 0;
  }
  *(undefined8 *)(puVar8 + -8) = 0x12795f;
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_7a8);
  if (local_7d0 != local_7c0) {
    *(undefined8 *)(puVar8 + -8) = 0x127974;
    operator_delete(local_7d0);
  }
  uVar10 = p._104_8_;
  if ((size_type *)p._104_8_ != &p.chrom._M_string_length) {
    *(undefined8 *)(puVar8 + -8) = 0x12798c;
    operator_delete((void *)uVar10);
  }
  uVar10 = p.inputFile.field_2._8_8_;
  if ((size_type *)p.inputFile.field_2._8_8_ != &p.outputPrefix._M_string_length) {
    *(undefined8 *)(puVar8 + -8) = 0x12799d;
    operator_delete((void *)uVar10);
  }
  auVar9 = local_1b8;
  if (local_1b8 != (undefined1  [8])&p.inputFile._M_string_length) {
    *(undefined8 *)(puVar8 + -8) = 0x1279ae;
    operator_delete((void *)auVar9);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  auto str = R"(
	***********************************
	****                           ****
	****        MATRYOSHKA 1.0     ****
	****                           ****
	***********************************
	)";

  namespace po = boost::program_options;
  using std::string;
  using std::cerr;


  class Params {
    public:
    string inputFile;
    string outputPrefix;
    double gammaMax;
    double gammaMin;
    size_t k;
    double stepSize;
    bool outputMultiscale;
    int minMeanSamples;
    int resolution;
    bool sparseFormat; //rao input data format
    string chrom;
  };

  Params p;

  // Declare the supported options.
  po::options_description opts("matryoshka options");
  opts.add_options()
  ("gammaMax,g", po::value<double>(&p.gammaMax)->required(), "gamma-max (highest resolution to generate domains)")
  ("gammaMin,x", po::value<double>(&p.gammaMin)->default_value(0), "gamma-min (lowest resolution to generate domains)")
  ("help,h", "Produce help message")
  ("input,i", po::value<string>(&p.inputFile)->required(), "Input matrix file, expected format (tab-separated): <chromo>\\t<start>\\t<end>\\t<f1 f2 ...>")
  ("topK,k", po::value<size_t>(&p.k)->default_value(1), "Compute the top k optimal solutions")  
  ("outputMultiscale,m", po::value<bool>(&p.outputMultiscale)->zero_tokens()->default_value(false), "Output multiscale domains that are used for clustering to files as well")
  ("minMeanSamples,n", po::value<int>(&p.minMeanSamples)->default_value(100), "Minimum required number of samples to compute a mean")
  ("output,o", po::value<string>(&p.outputPrefix)->required(), "Output filename prefix")  
  ("stepSize,s", po::value<double>(&p.stepSize)->default_value(0.05), "Step size to increment resolution parameter")
  ("resolution,r", po::value<int>(&p.resolution)->default_value(40000), "Resolution of data")
  ("parseSparseFormat,R", po::value<bool>(&p.sparseFormat)->zero_tokens()->default_value(false), "Parse the sparse matrix format")
  ("chromosome,c", po::value<string>(&p.chrom)->default_value("N/A"), "Chromosome");

  po::variables_map vm;
  try {
    po::store(po::parse_command_line(argc, argv, opts), vm);

    if (vm.count("help")) {
      cerr << str << "\n";
      cerr << opts << "\n";
      std::exit(1);
    }

    po::notify(vm);    

    if (vm.count("input")) {
      double eps = 1e-5;
      cerr << "Reading input from " << p.inputFile << ".\n";

      p.chrom = "chr" + p.chrom;
      MatrixProperties matProp;
      if (p.sparseFormat) {
        matProp = parseSparseMatrix(p.inputFile, p.resolution, p.chrom);
      } else { 
          matProp = parseGZipMatrix(p.inputFile);
      }
      auto mat = matProp.matrix;
      cerr << "MatrixParser read matrix of size: " << mat->size1() << " x " << mat->size2()  << "\n";

      auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples);

      int areaCovered = calCoverage(dEnsemble, matProp);
      int K = dEnsemble.domainSets.size();

      if (p.outputMultiscale) {
        cerr << "Writing all multi scale domains to file" << endl;
        for (int i=0; i<K; i++){
            auto multiscaleFile = p.outputPrefix + ".multiscale.txt";
            outputDomains(dEnsemble.domainSets[i], multiscaleFile, matProp, 0, p.gammaMin+(i*p.stepSize));
        }
      }
      
      double **VI_S = new double *[K];
      for(int i = 0; i < K; i++)
        VI_S[i] = new double[K];
      getVImatrix(dEnsemble, VI_S);

      //for (int i=0;i<K;i++){
      //  for (int j=0; j<K-1; j++)
      //    cerr << VI_S[i][j] << ",";
      //  cerr << VI_S[i][K-1] << endl;
      //}

      std::vector<int> PAMresult = getCluster(VI_S, K);
      int resultSize = PAMresult.size();
      std::vector<int> temp = PAMresult;
      auto uniqEnd = std::unique(temp.begin(), temp.end());
      int maxHier = std::distance(temp.begin(), uniqEnd);
      
      cerr << "There are " << maxHier << " levels of hierarchy with clustering: " << endl;
      for (int i = 0; i<resultSize; i++){
        cerr << PAMresult[i] << " ";
      }
      cerr << endl;

      double gammaMins[maxHier], gammaMaxes[maxHier], gammaTemp=p.gammaMin;
      int index, indexTemp=PAMresult[0], sizeFill=0;
      gammaMins[0] = p.gammaMin; //start of array min gamma
      gammaMaxes[maxHier-1] = p.gammaMax; //end of array max gamma
      for (int i=0; i<resultSize; i++) {
        index = int(PAMresult[i]);
        if (indexTemp != index) {
          gammaMins[sizeFill+1] = gammaTemp;
          gammaMaxes[sizeFill] = gammaTemp - p.stepSize;
          indexTemp = index;
          sizeFill++;
        }
        gammaTemp += p.stepSize;
      }
      
      int curIndex=1, pIndex=0;
      std::vector<Domain> dConsensusParent, dConsensusHier, dConsensusHierTemp;
      std::vector<std::vector<double>> allMu(K);

      index = 0;
      for (double gamma=p.gammaMin; gamma <= p.gammaMax+eps; gamma+=p.stepSize) {
        allMu[index] = getMu(mat, gamma, p.minMeanSamples);
        index++;
      }

      index = 0;
      for (int hier=1; hier<=maxHier; hier++) {
        if (hier==1) {
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];

          auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);
          dConsensusParent = consensusDomains(dEnsemble);
          
          auto consensusFile = p.outputPrefix + ".consensus.txt";
          cerr << "Writing consensus for level " << hier << endl;
          curIndex = outputDomains(dConsensusParent, consensusFile, matProp, hier, curIndex, -1);
          index = int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        } 
        else { 
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];
          if(dConsensusHierTemp.size() > 0) {
            dConsensusParent = dConsensusHierTemp;
            dConsensusHierTemp.clear();
          }

          for (auto d : dConsensusParent) {
            size_t start = d.start;
            size_t end = d.end;
            pIndex++;
            
            //boost::numeric::ublas::compressed_matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            //using SparseMatrix = boost::numeric::ublas::compressed_matrix<double>;
            //std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            boost::numeric::ublas::matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            using SparseMatrix = boost::numeric::ublas::matrix<double>;
            std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            matProp.matrix = mat_topass;
            auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);

            auto dConsensusHier = consensusDomains(dEnsemble);
            for (size_t i=0; i<dConsensusHier.size(); i++){
              dConsensusHier[i].start += start;
              dConsensusHier[i].end += start;
            }
            dConsensusHierTemp.insert(dConsensusHierTemp.end(), dConsensusHier.begin(), dConsensusHier.end());
            auto consensusFile = p.outputPrefix + ".consensus.txt";
            curIndex = outputDomains(dConsensusHier, consensusFile, matProp, hier, curIndex, pIndex);
          }
          cerr << "Writing consensus for level " << hier << endl;
          index += int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        }
      }

    } else {
      cerr << "Input file was not set.\n";
      std::exit(1);
    }

  } catch (po::error& e) {
    cerr << "exception : [" << e.what() << "]. Exiting.\n";
    std::exit(1);
  }

  return 0;
}